

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.h
# Opt level: O2

int base32_encode(uint8_t *data,int length,uint8_t *result,int bufSize)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  
  if (0x10000000 < (uint)length) {
    return -1;
  }
  if (length == 0) {
    uVar1 = 0;
LAB_0016ce04:
    if ((int)uVar1 < bufSize) {
      result[uVar1] = '\0';
    }
  }
  else {
    uVar6 = (uint)*data;
    uVar5 = 0;
    uVar1 = 0;
    if (0 < bufSize) {
      uVar1 = (ulong)(uint)bufSize;
    }
    iVar2 = 8;
    iVar3 = 1;
    for (; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      if (length <= iVar3 && iVar2 < 1) {
        uVar1 = uVar5 & 0xffffffff;
        goto LAB_0016ce04;
      }
      if (iVar2 < 5) {
        if (iVar3 < length) {
          lVar4 = (long)iVar3;
          iVar3 = iVar3 + 1;
          uVar6 = uVar6 << 8 | (uint)data[lVar4];
          iVar2 = iVar2 + 8;
        }
        else {
          uVar6 = uVar6 << (5U - (char)iVar2 & 0x1f);
          iVar2 = 5;
        }
      }
      iVar2 = iVar2 + -5;
      result[uVar5] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[(int)uVar6 >> ((byte)iVar2 & 0x1f) & 0x1f];
    }
  }
  return (int)uVar1;
}

Assistant:

int base32_encode(const uint8_t *data, int length, uint8_t *result, int bufSize) {
  if (length < 0 || length > (1 << 28)) {
    return -1;
  }
  int count = 0;
  if (length > 0) {
    int buffer = data[0];
    int next = 1;
    int bitsLeft = 8;
    while (count < bufSize && (bitsLeft > 0 || next < length)) {
      if (bitsLeft < 5) {
        if (next < length) {
          buffer <<= 8;
          buffer |= data[next++] & 0xFF;
          bitsLeft += 8;
        } else {
          int pad = 5 - bitsLeft;
          buffer <<= pad;
          bitsLeft += pad;
        }
      }
      int index = 0x1F & (buffer >> (bitsLeft - 5));
      bitsLeft -= 5;
      result[count++] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[index];
    }
  }
  if (count < bufSize) {
    result[count] = '\000';
  }
  return count;
}